

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

SSL_CREDENTIAL *
SSL_CREDENTIAL_new_spake2plusv1_client
          (uint8_t *context,size_t context_len,uint8_t *client_identity,size_t client_identity_len,
          uint8_t *server_identity,size_t server_identity_len,uint32_t error_limit,uint8_t *w0,
          size_t w0_len,uint8_t *w1,size_t w1_len)

{
  Span<const_unsigned_char> server_identity_00;
  bool bVar1;
  _Head_base<0UL,_ssl_credential_st_*,_false> _Var2;
  Span<const_unsigned_char> client_identity_00;
  Span<const_unsigned_char> context_00;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  UniquePtr<SSL_CREDENTIAL> cred;
  
  if ((w1_len == 0x20 && w0_len == 0x20) && (context_len == 0 || context != (uint8_t *)0x0)) {
    server_identity_00.size_ = server_identity_len;
    server_identity_00.data_ = server_identity;
    client_identity_00.size_ = (size_t)client_identity;
    client_identity_00.data_ = (uchar *)context_len;
    context_00.size_ = (size_t)context;
    context_00.data_ = (uchar *)0x2;
    ssl_credential_new_spake2plusv1
              ((SSLCredentialType)&cred,context_00,client_identity_00,server_identity_00,
               (uint32_t)client_identity_len);
    if ((((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)
          cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0) ||
        (in.size_ = 0x20, in.data_ = w0,
        bVar1 = bssl::Array<unsigned_char>::CopyFrom
                          ((Array<unsigned_char> *)
                           ((long)cred._M_t.
                                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl +
                           0x88),in), !bVar1)) ||
       (in_00.size_ = 0x20, in_00.data_ = w1,
       bVar1 = bssl::Array<unsigned_char>::CopyFrom
                         ((Array<unsigned_char> *)
                          ((long)cred._M_t.
                                 super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl +
                          0x98),in_00), _Var2._M_head_impl = (ssl_credential_st *)cred, !bVar1)) {
      _Var2._M_head_impl = (ssl_credential_st *)0x0;
    }
    else {
      cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
    }
    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&cred);
    return (SSL_CREDENTIAL *)(tuple<ssl_credential_st_*,_bssl::internal::Deleter>)_Var2._M_head_impl
    ;
  }
  ERR_put_error(0x10,0,0x144,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                ,0x20b);
  return (SSL_CREDENTIAL *)0x0;
}

Assistant:

SSL_CREDENTIAL *SSL_CREDENTIAL_new_spake2plusv1_client(
    const uint8_t *context, size_t context_len, const uint8_t *client_identity,
    size_t client_identity_len, const uint8_t *server_identity,
    size_t server_identity_len, uint32_t error_limit, const uint8_t *w0,
    size_t w0_len, const uint8_t *w1, size_t w1_len) {
  if (w0_len != spake2plus::kVerifierSize ||
      w1_len != spake2plus::kVerifierSize ||
      (context == nullptr && context_len != 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SPAKE2PLUSV1_VALUE);
    return nullptr;
  }

  UniquePtr<SSL_CREDENTIAL> cred = ssl_credential_new_spake2plusv1(
      SSLCredentialType::kSPAKE2PlusV1Client, Span(context, context_len),
      Span(client_identity, client_identity_len),
      Span(server_identity, server_identity_len), error_limit);
  if (!cred) {
    return nullptr;
  }

  if (!cred->password_verifier_w0.CopyFrom(Span(w0, w0_len)) ||
      !cred->password_verifier_w1.CopyFrom(Span(w1, w1_len))) {
    return nullptr;
  }

  return cred.release();
}